

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

PREDICTION_MODE read_intra_mode(aom_reader *r,aom_cdf_prob *cdf)

{
  int iVar1;
  aom_reader *in_RSI;
  aom_cdf_prob *in_stack_ffffffffffffffe8;
  
  iVar1 = aom_read_symbol_(in_RSI,in_stack_ffffffffffffffe8,0);
  return (PREDICTION_MODE)iVar1;
}

Assistant:

static PREDICTION_MODE read_intra_mode(aom_reader *r, aom_cdf_prob *cdf) {
  return (PREDICTION_MODE)aom_read_symbol(r, cdf, INTRA_MODES, ACCT_STR);
}